

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

mat3f * __thiscall hmi::renderer::get_view_matrix(renderer *this)

{
  long in_RSI;
  mat<float,_3UL> *in_RDI;
  float fVar1;
  float fVar2;
  mat3f translation;
  mat3f scaling;
  undefined8 in_stack_ffffffffffffffb0;
  mat<float,_3UL> local_2c;
  
  fVar1 = vec_accessor::operator_cast_to_float((vec_accessor *)(in_RSI + 0x18));
  fVar2 = vec_accessor::operator_cast_to_float((vec_accessor *)(in_RSI + 0x18));
  mat<float,_3UL>::mat(&local_2c,2.0 / fVar1,0.0,0.0,0.0,-2.0 / fVar2,0.0,0.0,0.0,1.0);
  fVar1 = vec_accessor::operator_cast_to_float((vec_accessor *)(in_RSI + 0x10));
  fVar2 = vec_accessor::operator_cast_to_float((vec_accessor *)(in_RSI + 0x10));
  mat<float,_3UL>::mat
            ((mat<float,_3UL> *)&stack0xffffffffffffffb0,1.0,0.0,-fVar1,0.0,1.0,-fVar2,0.0,0.0,1.0);
  operator*((mat<float,_3UL> *)in_stack_ffffffffffffffb0,in_RDI);
  return in_RDI;
}

Assistant:

mat3f renderer::get_view_matrix() const {
    mat3f scaling(
      2.0f / m_view_size.x, 0.0f,                   0.0f,
      0.0f,                 - 2.0f / m_view_size.y, 0.0f,
      0.0f,                 0.0f,                   1.0f
    );

    mat3f translation(
      1.0f, 0.0f, - m_view_center.x,
      0.0f, 1.0f, - m_view_center.y,
      0.0f, 0.0f, 1.0f
    );

    return scaling * translation;
  }